

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  ImGuiPopupData *pIVar1;
  byte in_SIL;
  uint in_EDI;
  ImGuiWindow *focus_window;
  ImGuiWindow *popup_backup_nav_window;
  ImGuiWindow *popup_window;
  ImGuiContext *g;
  int in_stack_ffffffffffffffcc;
  ImVector<ImGuiPopupData> *in_stack_ffffffffffffffd0;
  ImGuiWindow *window;
  ImGuiWindow *ignore_window;
  ImGuiContext *window_00;
  
  window_00 = GImGui;
  if ((GImGui->DebugLogFlags & 4U) != 0) {
    DebugLog("[popup] ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n",(ulong)in_EDI
             ,(ulong)(in_SIL & 1));
  }
  pIVar1 = ImVector<ImGuiPopupData>::operator[](&window_00->OpenPopupStack,in_EDI);
  ignore_window = pIVar1->Window;
  pIVar1 = ImVector<ImGuiPopupData>::operator[](&window_00->OpenPopupStack,in_EDI);
  window = pIVar1->BackupNavWindow;
  ImVector<ImGuiPopupData>::resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  if ((in_SIL & 1) != 0) {
    if ((ignore_window != (ImGuiWindow *)0x0) && ((ignore_window->Flags & 0x10000000U) != 0)) {
      window = ignore_window->ParentWindow;
    }
    if (((window == (ImGuiWindow *)0x0) || ((window->WasActive & 1U) != 0)) ||
       (ignore_window == (ImGuiWindow *)0x0)) {
      if ((window_00->NavLayer == ImGuiNavLayer_Main) && (window != (ImGuiWindow *)0x0)) {
        NavRestoreLastChildNavWindow(window);
      }
      FocusWindow((ImGuiWindow *)window_00);
    }
    else {
      FocusTopMostWindowUnderOne((ImGuiWindow *)window_00,ignore_window);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("[popup] ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    ImGuiWindow* popup_backup_nav_window = g.OpenPopupStack[remaining].BackupNavWindow;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        ImGuiWindow* focus_window = (popup_window && popup_window->Flags & ImGuiWindowFlags_ChildMenu) ? popup_window->ParentWindow : popup_backup_nav_window;
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == ImGuiNavLayer_Main && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}